

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btNNCGConstraintSolver.cpp
# Opt level: O1

btScalar __thiscall
btNNCGConstraintSolver::solveGroupCacheFriendlySetup
          (btNNCGConstraintSolver *this,btCollisionObject **bodies,int numBodies,
          btPersistentManifold **manifoldPtr,int numManifolds,btTypedConstraint **constraints,
          int numConstraints,btContactSolverInfo *infoGlobal,btIDebugDraw *debugDrawer)

{
  int iVar1;
  float *pfVar2;
  float *pfVar3;
  long lVar4;
  long lVar5;
  btScalar bVar6;
  
  bVar6 = btSequentialImpulseConstraintSolver::solveGroupCacheFriendlySetup
                    (&this->super_btSequentialImpulseConstraintSolver,bodies,numBodies,manifoldPtr,
                     numManifolds,constraints,numConstraints,infoGlobal,debugDrawer);
  iVar1 = (this->super_btSequentialImpulseConstraintSolver).m_tmpSolverNonContactConstraintPool.
          m_size;
  if (((this->m_pNC).m_size < iVar1) && ((this->m_pNC).m_capacity < iVar1)) {
    if (iVar1 == 0) {
      pfVar3 = (float *)0x0;
    }
    else {
      pfVar3 = (float *)btAlignedAllocInternal((long)iVar1 << 2,0x10);
    }
    lVar4 = (long)(this->m_pNC).m_size;
    if (0 < lVar4) {
      pfVar2 = (this->m_pNC).m_data;
      lVar5 = 0;
      do {
        pfVar3[lVar5] = pfVar2[lVar5];
        lVar5 = lVar5 + 1;
      } while (lVar4 != lVar5);
    }
    pfVar2 = (this->m_pNC).m_data;
    if (pfVar2 != (float *)0x0) {
      if ((this->m_pNC).m_ownsMemory == true) {
        btAlignedFreeInternal(pfVar2);
      }
      (this->m_pNC).m_data = (float *)0x0;
    }
    (this->m_pNC).m_ownsMemory = true;
    (this->m_pNC).m_data = pfVar3;
    (this->m_pNC).m_capacity = iVar1;
  }
  (this->m_pNC).m_size = iVar1;
  iVar1 = (this->super_btSequentialImpulseConstraintSolver).m_tmpSolverContactConstraintPool.m_size;
  if (((this->m_pC).m_size < iVar1) && ((this->m_pC).m_capacity < iVar1)) {
    if (iVar1 == 0) {
      pfVar3 = (float *)0x0;
    }
    else {
      pfVar3 = (float *)btAlignedAllocInternal((long)iVar1 << 2,0x10);
    }
    lVar4 = (long)(this->m_pC).m_size;
    if (0 < lVar4) {
      pfVar2 = (this->m_pC).m_data;
      lVar5 = 0;
      do {
        pfVar3[lVar5] = pfVar2[lVar5];
        lVar5 = lVar5 + 1;
      } while (lVar4 != lVar5);
    }
    pfVar2 = (this->m_pC).m_data;
    if (pfVar2 != (float *)0x0) {
      if ((this->m_pC).m_ownsMemory == true) {
        btAlignedFreeInternal(pfVar2);
      }
      (this->m_pC).m_data = (float *)0x0;
    }
    (this->m_pC).m_ownsMemory = true;
    (this->m_pC).m_data = pfVar3;
    (this->m_pC).m_capacity = iVar1;
  }
  (this->m_pC).m_size = iVar1;
  iVar1 = (this->super_btSequentialImpulseConstraintSolver).m_tmpSolverContactFrictionConstraintPool
          .m_size;
  if (((this->m_pCF).m_size < iVar1) && ((this->m_pCF).m_capacity < iVar1)) {
    if (iVar1 == 0) {
      pfVar3 = (float *)0x0;
    }
    else {
      pfVar3 = (float *)btAlignedAllocInternal((long)iVar1 << 2,0x10);
    }
    lVar4 = (long)(this->m_pCF).m_size;
    if (0 < lVar4) {
      pfVar2 = (this->m_pCF).m_data;
      lVar5 = 0;
      do {
        pfVar3[lVar5] = pfVar2[lVar5];
        lVar5 = lVar5 + 1;
      } while (lVar4 != lVar5);
    }
    pfVar2 = (this->m_pCF).m_data;
    if (pfVar2 != (float *)0x0) {
      if ((this->m_pCF).m_ownsMemory == true) {
        btAlignedFreeInternal(pfVar2);
      }
      (this->m_pCF).m_data = (float *)0x0;
    }
    (this->m_pCF).m_ownsMemory = true;
    (this->m_pCF).m_data = pfVar3;
    (this->m_pCF).m_capacity = iVar1;
  }
  (this->m_pCF).m_size = iVar1;
  iVar1 = (this->super_btSequentialImpulseConstraintSolver).
          m_tmpSolverContactRollingFrictionConstraintPool.m_size;
  if (((this->m_pCRF).m_size < iVar1) && ((this->m_pCRF).m_capacity < iVar1)) {
    if (iVar1 == 0) {
      pfVar3 = (float *)0x0;
    }
    else {
      pfVar3 = (float *)btAlignedAllocInternal((long)iVar1 << 2,0x10);
    }
    lVar4 = (long)(this->m_pCRF).m_size;
    if (0 < lVar4) {
      pfVar2 = (this->m_pCRF).m_data;
      lVar5 = 0;
      do {
        pfVar3[lVar5] = pfVar2[lVar5];
        lVar5 = lVar5 + 1;
      } while (lVar4 != lVar5);
    }
    pfVar2 = (this->m_pCRF).m_data;
    if (pfVar2 != (float *)0x0) {
      if ((this->m_pCRF).m_ownsMemory == true) {
        btAlignedFreeInternal(pfVar2);
      }
      (this->m_pCRF).m_data = (float *)0x0;
    }
    (this->m_pCRF).m_ownsMemory = true;
    (this->m_pCRF).m_data = pfVar3;
    (this->m_pCRF).m_capacity = iVar1;
  }
  (this->m_pCRF).m_size = iVar1;
  iVar1 = (this->super_btSequentialImpulseConstraintSolver).m_tmpSolverNonContactConstraintPool.
          m_size;
  if (((this->m_deltafNC).m_size < iVar1) && ((this->m_deltafNC).m_capacity < iVar1)) {
    if (iVar1 == 0) {
      pfVar3 = (float *)0x0;
    }
    else {
      pfVar3 = (float *)btAlignedAllocInternal((long)iVar1 << 2,0x10);
    }
    lVar4 = (long)(this->m_deltafNC).m_size;
    if (0 < lVar4) {
      pfVar2 = (this->m_deltafNC).m_data;
      lVar5 = 0;
      do {
        pfVar3[lVar5] = pfVar2[lVar5];
        lVar5 = lVar5 + 1;
      } while (lVar4 != lVar5);
    }
    pfVar2 = (this->m_deltafNC).m_data;
    if (pfVar2 != (float *)0x0) {
      if ((this->m_deltafNC).m_ownsMemory == true) {
        btAlignedFreeInternal(pfVar2);
      }
      (this->m_deltafNC).m_data = (float *)0x0;
    }
    (this->m_deltafNC).m_ownsMemory = true;
    (this->m_deltafNC).m_data = pfVar3;
    (this->m_deltafNC).m_capacity = iVar1;
  }
  (this->m_deltafNC).m_size = iVar1;
  iVar1 = (this->super_btSequentialImpulseConstraintSolver).m_tmpSolverContactConstraintPool.m_size;
  if (((this->m_deltafC).m_size < iVar1) && ((this->m_deltafC).m_capacity < iVar1)) {
    if (iVar1 == 0) {
      pfVar3 = (float *)0x0;
    }
    else {
      pfVar3 = (float *)btAlignedAllocInternal((long)iVar1 << 2,0x10);
    }
    lVar4 = (long)(this->m_deltafC).m_size;
    if (0 < lVar4) {
      pfVar2 = (this->m_deltafC).m_data;
      lVar5 = 0;
      do {
        pfVar3[lVar5] = pfVar2[lVar5];
        lVar5 = lVar5 + 1;
      } while (lVar4 != lVar5);
    }
    pfVar2 = (this->m_deltafC).m_data;
    if (pfVar2 != (float *)0x0) {
      if ((this->m_deltafC).m_ownsMemory == true) {
        btAlignedFreeInternal(pfVar2);
      }
      (this->m_deltafC).m_data = (float *)0x0;
    }
    (this->m_deltafC).m_ownsMemory = true;
    (this->m_deltafC).m_data = pfVar3;
    (this->m_deltafC).m_capacity = iVar1;
  }
  (this->m_deltafC).m_size = iVar1;
  iVar1 = (this->super_btSequentialImpulseConstraintSolver).m_tmpSolverContactFrictionConstraintPool
          .m_size;
  if (((this->m_deltafCF).m_size < iVar1) && ((this->m_deltafCF).m_capacity < iVar1)) {
    if (iVar1 == 0) {
      pfVar3 = (float *)0x0;
    }
    else {
      pfVar3 = (float *)btAlignedAllocInternal((long)iVar1 << 2,0x10);
    }
    lVar4 = (long)(this->m_deltafCF).m_size;
    if (0 < lVar4) {
      pfVar2 = (this->m_deltafCF).m_data;
      lVar5 = 0;
      do {
        pfVar3[lVar5] = pfVar2[lVar5];
        lVar5 = lVar5 + 1;
      } while (lVar4 != lVar5);
    }
    pfVar2 = (this->m_deltafCF).m_data;
    if (pfVar2 != (float *)0x0) {
      if ((this->m_deltafCF).m_ownsMemory == true) {
        btAlignedFreeInternal(pfVar2);
      }
      (this->m_deltafCF).m_data = (float *)0x0;
    }
    (this->m_deltafCF).m_ownsMemory = true;
    (this->m_deltafCF).m_data = pfVar3;
    (this->m_deltafCF).m_capacity = iVar1;
  }
  (this->m_deltafCF).m_size = iVar1;
  iVar1 = (this->super_btSequentialImpulseConstraintSolver).
          m_tmpSolverContactRollingFrictionConstraintPool.m_size;
  if (((this->m_deltafCRF).m_size < iVar1) && ((this->m_deltafCRF).m_capacity < iVar1)) {
    if (iVar1 == 0) {
      pfVar3 = (float *)0x0;
    }
    else {
      pfVar3 = (float *)btAlignedAllocInternal((long)iVar1 << 2,0x10);
    }
    lVar4 = (long)(this->m_deltafCRF).m_size;
    if (0 < lVar4) {
      pfVar2 = (this->m_deltafCRF).m_data;
      lVar5 = 0;
      do {
        pfVar3[lVar5] = pfVar2[lVar5];
        lVar5 = lVar5 + 1;
      } while (lVar4 != lVar5);
    }
    pfVar2 = (this->m_deltafCRF).m_data;
    if (pfVar2 != (float *)0x0) {
      if ((this->m_deltafCRF).m_ownsMemory == true) {
        btAlignedFreeInternal(pfVar2);
      }
      (this->m_deltafCRF).m_data = (float *)0x0;
    }
    (this->m_deltafCRF).m_ownsMemory = true;
    (this->m_deltafCRF).m_data = pfVar3;
    (this->m_deltafCRF).m_capacity = iVar1;
  }
  (this->m_deltafCRF).m_size = iVar1;
  return bVar6;
}

Assistant:

btScalar btNNCGConstraintSolver::solveGroupCacheFriendlySetup(btCollisionObject** bodies,int numBodies,btPersistentManifold** manifoldPtr, int numManifolds,btTypedConstraint** constraints,int numConstraints,const btContactSolverInfo& infoGlobal,btIDebugDraw* debugDrawer)
{
	btScalar val = btSequentialImpulseConstraintSolver::solveGroupCacheFriendlySetup( bodies,numBodies,manifoldPtr, numManifolds, constraints,numConstraints,infoGlobal,debugDrawer);

	m_pNC.resizeNoInitialize(m_tmpSolverNonContactConstraintPool.size());
	m_pC.resizeNoInitialize(m_tmpSolverContactConstraintPool.size());
	m_pCF.resizeNoInitialize(m_tmpSolverContactFrictionConstraintPool.size());
	m_pCRF.resizeNoInitialize(m_tmpSolverContactRollingFrictionConstraintPool.size());

	m_deltafNC.resizeNoInitialize(m_tmpSolverNonContactConstraintPool.size());
	m_deltafC.resizeNoInitialize(m_tmpSolverContactConstraintPool.size());
	m_deltafCF.resizeNoInitialize(m_tmpSolverContactFrictionConstraintPool.size());
	m_deltafCRF.resizeNoInitialize(m_tmpSolverContactRollingFrictionConstraintPool.size());

	return val;
}